

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void btreeParseCellPtr(MemPage *pPage,u8 *pCell,CellInfo *pInfo)

{
  byte *pbVar1;
  byte *pbVar2;
  bool local_49;
  u8 *pEnd_1;
  u8 *pEnd;
  u64 iKey;
  byte *pbStack_28;
  u32 nPayload;
  u8 *pIter;
  CellInfo *pInfo_local;
  u8 *pCell_local;
  MemPage *pPage_local;
  
  iKey._4_4_ = (uint)*pCell;
  pbStack_28 = pCell;
  if (0x7f < iKey._4_4_) {
    iKey._4_4_ = iKey._4_4_ & 0x7f;
    pbStack_28 = pCell;
    do {
      pbVar2 = pbStack_28 + 1;
      iKey._4_4_ = iKey._4_4_ << 7 | pbStack_28[1] & 0x7f;
      local_49 = 0x7f < *pbVar2 && pbVar2 < pCell + 8;
      pbStack_28 = pbVar2;
    } while (local_49);
  }
  pbVar2 = pbStack_28 + 1;
  pEnd = (u8 *)(ulong)*pbVar2;
  if ((u8 *)0x7f < pEnd) {
    pbVar1 = pbStack_28 + 8;
    pEnd = (u8 *)((ulong)pEnd & 0x7f);
    do {
      pbStack_28 = pbVar2;
      pbVar2 = pbStack_28 + 1;
      pEnd = (u8 *)((long)pEnd << 7 | (long)(int)(pbStack_28[1] & 0x7f));
      if (*pbVar2 < 0x80) goto LAB_00141a77;
    } while (pbVar2 < pbVar1);
    pEnd = (u8 *)((long)pEnd << 8 | (ulong)pbStack_28[2]);
    pbVar2 = pbStack_28 + 2;
  }
LAB_00141a77:
  pbStack_28 = pbVar2;
  pInfo->nKey = (i64)pEnd;
  pInfo->nPayload = iKey._4_4_;
  pInfo->pPayload = pbStack_28 + 1;
  if (pPage->maxLocal < iKey._4_4_) {
    btreeParseCellAdjustSizeForOverflow(pPage,pCell,pInfo);
  }
  else {
    pInfo->nSize = (u16)iKey._4_4_ + ((short)(pbStack_28 + 1) - (short)pCell);
    if (pInfo->nSize < 4) {
      pInfo->nSize = 4;
    }
    pInfo->nLocal = (u16)iKey._4_4_;
  }
  return;
}

Assistant:

static void btreeParseCellPtr(
  MemPage *pPage,         /* Page containing the cell */
  u8 *pCell,              /* Pointer to the cell text. */
  CellInfo *pInfo         /* Fill in this structure */
){
  u8 *pIter;              /* For scanning through pCell */
  u32 nPayload;           /* Number of bytes of cell payload */
  u64 iKey;               /* Extracted Key value */

  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( pPage->leaf==0 || pPage->leaf==1 );
  assert( pPage->intKeyLeaf );
  assert( pPage->childPtrSize==0 );
  pIter = pCell;

  /* The next block of code is equivalent to:
  **
  **     pIter += getVarint32(pIter, nPayload);
  **
  ** The code is inlined to avoid a function call.
  */
  nPayload = *pIter;
  if( nPayload>=0x80 ){
    u8 *pEnd = &pIter[8];
    nPayload &= 0x7f;
    do{
      nPayload = (nPayload<<7) | (*++pIter & 0x7f);
    }while( (*pIter)>=0x80 && pIter<pEnd );
  }
  pIter++;

  /* The next block of code is equivalent to:
  **
  **     pIter += getVarint(pIter, (u64*)&pInfo->nKey);
  **
  ** The code is inlined to avoid a function call.
  */
  iKey = *pIter;
  if( iKey>=0x80 ){
    u8 *pEnd = &pIter[7];
    iKey &= 0x7f;
    while(1){
      iKey = (iKey<<7) | (*++pIter & 0x7f);
      if( (*pIter)<0x80 ) break;
      if( pIter>=pEnd ){
        iKey = (iKey<<8) | *++pIter;
        break;
      }
    }
  }
  pIter++;

  pInfo->nKey = *(i64*)&iKey;
  pInfo->nPayload = nPayload;
  pInfo->pPayload = pIter;
  testcase( nPayload==pPage->maxLocal );
  testcase( nPayload==pPage->maxLocal+1 );
  if( nPayload<=pPage->maxLocal ){
    /* This is the (easy) common case where the entire payload fits
    ** on the local page.  No overflow is required.
    */
    pInfo->nSize = nPayload + (u16)(pIter - pCell);
    if( pInfo->nSize<4 ) pInfo->nSize = 4;
    pInfo->nLocal = (u16)nPayload;
  }else{
    btreeParseCellAdjustSizeForOverflow(pPage, pCell, pInfo);
  }
}